

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::BasicGLSLConst::Run(BasicGLSLConst *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  ContextType ctxType;
  GLuint GVar2;
  GLint GVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  char *pcVar7;
  int h;
  vec4 *expected;
  GLint i;
  ostringstream src_fs;
  GLint local_1bc;
  vec4 *local_1b8;
  undefined8 uStack_1b0;
  vec4 local_1a8;
  undefined1 local_198 [376];
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x144);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"#version ",9);
  pcVar7 = "#version 420";
  if (bVar1) {
    pcVar7 = "#version 440";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar7 + 9,3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," core",5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "\nlayout(location = 0) out vec4 o_color;\nuniform int MaxImageUnits;\nuniform int MaxCombinedShaderOutputResources;\nuniform int MaxImageSamples;\nuniform int MaxVertexImageUniforms;\nuniform int MaxTessControlImageUniforms;\nuniform int MaxTessEvaluationImageUniforms;\nuniform int MaxGeometryImageUniforms;\nuniform int MaxFragmentImageUniforms;\nuniform int MaxCombinedImageUniforms;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  if (gl_MaxImageUnits != MaxImageUnits) o_color = vec4(1.0, 0.0, 0.0, 0.1);"
             ,0x1f9);
  pcVar7 = 
  "\n  if (gl_MaxCombinedImageUnitsAndFragmentOutputs != MaxCombinedShaderOutputResources) o_color = vec4(0.2, 0.0, 0.0, 0.2);"
  ;
  if (bVar1) {
    pcVar7 = 
    "\n  if (gl_MaxCombinedShaderOutputResources != MaxCombinedShaderOutputResources) o_color = vec4(0.2, 0.0, 0.0, 0.2);"
    ;
  }
  lVar6 = 0x7a;
  if (bVar1) {
    lVar6 = 0x73;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar7,lVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "\n  if (gl_MaxImageSamples != MaxImageSamples) o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (gl_MaxVertexImageUniforms != MaxVertexImageUniforms) o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  if (gl_MaxTessControlImageUniforms != MaxTessControlImageUniforms) o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  if (gl_MaxTessEvaluationImageUniforms != MaxTessEvaluationImageUniforms) o_color = vec4(1.0, 0.0, 0.0, 0.6);\n  if (gl_MaxGeometryImageUniforms != MaxGeometryImageUniforms) o_color = vec4(1.0, 0.0, 0.0, 0.7);\n  if (gl_MaxFragmentImageUniforms != MaxFragmentImageUniforms) o_color = vec4(1.0, 0.0, 0.0, 0.8);\n  if (gl_MaxCombinedImageUniforms != MaxCombinedImageUniforms) o_color = vec4(1.0, 0.0, 0.0, 0.9);\n}"
             ,0x2b3);
  std::__cxx11::stringbuf::str();
  h = 0;
  expected = local_1b8;
  GVar2 = ShaderImageLoadStoreBase::BuildProgram
                    (&this->super_ShaderImageLoadStoreBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)local_1b8,(bool *)0x0);
  this->m_program = GVar2;
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8.m_data._0_8_ + 1);
  }
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8f38,&local_1bc);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"MaxImageUnits");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,local_1bc);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8f39,&local_1bc);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (this_00,this->m_program,"MaxCombinedShaderOutputResources");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,local_1bc);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x906d,&local_1bc);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"MaxImageSamples");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,local_1bc);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90ca,&local_1bc);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (this_00,this->m_program,"MaxVertexImageUniforms");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,local_1bc);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90cb,&local_1bc);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (this_00,this->m_program,"MaxTessControlImageUniforms");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,local_1bc);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90cc,&local_1bc);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (this_00,this->m_program,"MaxTessEvaluationImageUniforms");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,local_1bc);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90cd,&local_1bc);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (this_00,this->m_program,"MaxGeometryImageUniforms");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,local_1bc);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90ce,&local_1bc);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (this_00,this->m_program,"MaxFragmentImageUniforms");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,local_1bc);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90cf,&local_1bc);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (this_00,this->m_program,"MaxCombinedImageUniforms");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,local_1bc);
  ShaderImageLoadStoreBase::CreateFullViewportQuad
            (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,(GLuint *)0x0);
  glu::CallLogWrapper::glClear(this_00,0x4000);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  iVar4 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar4 = *(int *)CONCAT44(extraout_var,iVar4);
  iVar5 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  local_1b8 = (vec4 *)0x3f80000000000000;
  uStack_1b0 = 0x3f80000000000000;
  bVar1 = ShaderImageLoadStoreBase::ValidateReadBuffer
                    (&this->super_ShaderImageLoadStoreBase,iVar4,
                     *(int *)(CONCAT44(extraout_var_00,iVar5) + 4),(int)&local_1b8,h,expected);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  return (ulong)bVar1 - 1;
}

Assistant:

virtual long Run()
	{
		bool isAtLeast44Context =
			glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 4));

		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL
							 "  gl_Position = i_position;" NL "}";
		std::ostringstream src_fs;
		src_fs << "#version " << (isAtLeast44Context ? "440" : "420") << " core";
		src_fs << NL "layout(location = 0) out vec4 o_color;" NL "uniform int MaxImageUnits;" NL
					 "uniform int MaxCombinedShaderOutputResources;" NL "uniform int MaxImageSamples;" NL
					 "uniform int MaxVertexImageUniforms;" NL "uniform int MaxTessControlImageUniforms;" NL
					 "uniform int MaxTessEvaluationImageUniforms;" NL "uniform int MaxGeometryImageUniforms;" NL
					 "uniform int MaxFragmentImageUniforms;" NL "uniform int MaxCombinedImageUniforms;" NL
					 "void main() {" NL "  o_color = vec4(0.0, 1.0, 0.0, 1.0);" NL
					 "  if (gl_MaxImageUnits != MaxImageUnits) o_color = vec4(1.0, 0.0, 0.0, 0.1);";
		if (isAtLeast44Context)
			src_fs << NL "  if (gl_MaxCombinedShaderOutputResources != MaxCombinedShaderOutputResources) o_color = "
						 "vec4(0.2, 0.0, 0.0, 0.2);";
		else
			src_fs << NL "  if (gl_MaxCombinedImageUnitsAndFragmentOutputs != MaxCombinedShaderOutputResources) "
						 "o_color = vec4(0.2, 0.0, 0.0, 0.2);";
		src_fs << NL
			"  if (gl_MaxImageSamples != MaxImageSamples) o_color = vec4(1.0, 0.0, 0.0, 0.3);" NL
			"  if (gl_MaxVertexImageUniforms != MaxVertexImageUniforms) o_color = vec4(1.0, 0.0, 0.0, 0.4);" NL
			"  if (gl_MaxTessControlImageUniforms != MaxTessControlImageUniforms) o_color = vec4(1.0, 0.0, 0.0, "
			"0.5);" NL "  if (gl_MaxTessEvaluationImageUniforms != MaxTessEvaluationImageUniforms) o_color = vec4(1.0, "
			"0.0, 0.0, 0.6);" NL
			"  if (gl_MaxGeometryImageUniforms != MaxGeometryImageUniforms) o_color = vec4(1.0, 0.0, 0.0, 0.7);" NL
			"  if (gl_MaxFragmentImageUniforms != MaxFragmentImageUniforms) o_color = vec4(1.0, 0.0, 0.0, 0.8);" NL
			"  if (gl_MaxCombinedImageUniforms != MaxCombinedImageUniforms) o_color = vec4(1.0, 0.0, 0.0, 0.9);" NL "}";

		m_program = BuildProgram(src_vs, NULL, NULL, NULL, src_fs.str().c_str());
		glUseProgram(m_program);

		GLint i;
		glGetIntegerv(GL_MAX_IMAGE_UNITS, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxImageUnits"), i);

		glGetIntegerv(GL_MAX_COMBINED_SHADER_OUTPUT_RESOURCES, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxCombinedShaderOutputResources"), i);

		glGetIntegerv(GL_MAX_IMAGE_SAMPLES, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxImageSamples"), i);

		glGetIntegerv(GL_MAX_VERTEX_IMAGE_UNIFORMS, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxVertexImageUniforms"), i);

		glGetIntegerv(GL_MAX_TESS_CONTROL_IMAGE_UNIFORMS, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxTessControlImageUniforms"), i);

		glGetIntegerv(GL_MAX_TESS_EVALUATION_IMAGE_UNIFORMS, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxTessEvaluationImageUniforms"), i);

		glGetIntegerv(GL_MAX_GEOMETRY_IMAGE_UNIFORMS, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxGeometryImageUniforms"), i);

		glGetIntegerv(GL_MAX_FRAGMENT_IMAGE_UNIFORMS, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxFragmentImageUniforms"), i);

		glGetIntegerv(GL_MAX_COMBINED_IMAGE_UNIFORMS, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxCombinedImageUniforms"), i);

		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);

		glClear(GL_COLOR_BUFFER_BIT);
		glBindVertexArray(m_vao);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec4(0, 1, 0, 1)))
		{
			return ERROR;
		}
		return NO_ERROR;
	}